

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraCommands.cpp
# Opt level: O0

ResponseLine * __thiscall
IRCDisconnectGenericCommand::trigger(IRCDisconnectGenericCommand *this,string_view parameters)

{
  ResponseLine *pRVar1;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  size_t local_70;
  char *local_68;
  size_t local_60;
  char *local_58;
  size_t local_40;
  char *local_38;
  long local_30;
  IRC_Bot *server;
  IRCDisconnectGenericCommand *this_local;
  string_view parameters_local;
  
  if (IRCCommand::selected_server == 0) {
    if (IRCCommand::active_server == 0) {
      pRVar1 = (ResponseLine *)operator_new(0x30);
      bVar2 = sv("Error: No IRC server is currently selected.",0x2b);
      local_40 = bVar2._M_len;
      local_38 = bVar2._M_str;
      Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar1,local_40,local_38,2);
      return pRVar1;
    }
    local_30 = IRCCommand::active_server;
  }
  else {
    local_30 = IRCCommand::selected_server;
  }
  bVar2 = sv("Disconnect command used.",0x18);
  local_60 = bVar2._M_len;
  local_58 = bVar2._M_str;
  Jupiter::IRC::Client::disconnect(local_30,local_60,local_58,1);
  pRVar1 = (ResponseLine *)operator_new(0x30);
  bVar2 = sv("Disconnected from server.",0x19);
  local_70 = bVar2._M_len;
  local_68 = bVar2._M_str;
  Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar1,local_70,local_68,0);
  return pRVar1;
}

Assistant:

Jupiter::GenericCommand::ResponseLine *IRCDisconnectGenericCommand::trigger(std::string_view parameters)
{
	IRC_Bot *server;
	if (IRCCommand::selected_server != nullptr)
		server = IRCCommand::selected_server;
	else if (IRCCommand::active_server != nullptr)
		server = IRCCommand::active_server;
	else
		return new Jupiter::GenericCommand::ResponseLine("Error: No IRC server is currently selected."sv, GenericCommand::DisplayType::PublicError);

	server->disconnect("Disconnect command used."sv, true);
	return new Jupiter::GenericCommand::ResponseLine("Disconnected from server."sv, GenericCommand::DisplayType::PublicSuccess);
}